

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O2

QpVector * __thiscall QpVector::operator-(QpVector *__return_storage_ptr__,QpVector *this)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer pdVar5;
  long lVar6;
  
  QpVector(__return_storage_ptr__,this->dim);
  piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (__return_storage_ptr__->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (__return_storage_ptr__->value).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (lVar6 = 0; lVar6 < this->num_nz; lVar6 = lVar6 + 1) {
    iVar1 = piVar2[lVar6];
    piVar4[lVar6] = iVar1;
    pdVar5[iVar1] = -pdVar3[iVar1];
  }
  __return_storage_ptr__->num_nz = this->num_nz;
  return __return_storage_ptr__;
}

Assistant:

QpVector operator-() const {
    QpVector result(dim);

    for (HighsInt i = 0; i < num_nz; i++) {
      result.index[i] = index[i];
      result.value[index[i]] = -value[index[i]];
    }
    result.num_nz = num_nz;

    return result;
  }